

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary.cc
# Opt level: O1

int32_t __thiscall
fasttext::Dictionary::getLine
          (Dictionary *this,istream *in,vector<int,_std::allocator<int>_> *words,
          vector<int,_std::allocator<int>_> *labels)

{
  pointer piVar1;
  element_type *peVar2;
  iterator __position;
  size_type sVar3;
  bool bVar4;
  entry_type eVar5;
  int32_t iVar6;
  long lVar7;
  size_type sVar8;
  int32_t iVar9;
  int iVar10;
  _Alloc_hider _Var11;
  uint32_t h;
  string_view w;
  string_view token_00;
  vector<int,_std::allocator<int>_> word_hashes;
  string token;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_98;
  int *local_88;
  string local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_48;
  vector<int,_std::allocator<int>_> *local_40;
  istream *local_38;
  
  local_98._M_allocated_capacity = 0;
  local_98._8_8_ = (int *)0x0;
  local_88 = (int *)0x0;
  local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  local_78._M_string_length = 0;
  local_78.field_2._M_local_buf[0] = '\0';
  _Var11._M_p = (pointer)this;
  local_48 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)labels;
  local_38 = in;
  reset(this,in);
  piVar1 = (words->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  if ((words->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_finish != piVar1) {
    (words->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_finish
         = piVar1;
  }
  if (*(char **)((long)local_48 + 8) != (char *)local_48->_M_allocated_capacity) {
    *(char **)((long)local_48 + 8) = (char *)local_48->_M_allocated_capacity;
  }
  iVar9 = 0;
  local_40 = words;
  do {
    do {
      bVar4 = readWord((Dictionary *)_Var11._M_p,local_38,&local_78);
      sVar3 = local_78._M_string_length;
      _Var11._M_p = local_78._M_dataplus._M_p;
      if (!bVar4) goto LAB_0011352c;
      h = 0x811c9dc5;
      if (local_78._M_string_length != 0) {
        lVar7 = 0;
        do {
          h = ((int)local_78._M_dataplus._M_p[lVar7] ^ h) * 0x1000193;
          lVar7 = lVar7 + 1;
        } while (local_78._M_string_length != lVar7);
      }
      w._M_str = local_78._M_dataplus._M_p;
      w._M_len = local_78._M_string_length;
      iVar6 = find(this,w,h);
      iVar6 = (this->word2int_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[iVar6];
      if (iVar6 < 0) {
        local_58._M_allocated_capacity = sVar3;
        local_58._8_8_ = _Var11._M_p;
        peVar2 = (this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_ptr
        ;
        _Var11._M_p = (pointer)&local_58;
        sVar8 = std::basic_string_view<char,_std::char_traits<char>_>::find
                          ((basic_string_view<char,_std::char_traits<char>_> *)_Var11._M_p,
                           (peVar2->label)._M_dataplus._M_p,0,(peVar2->label)._M_string_length);
        eVar5 = sVar8 == 0;
      }
      else {
        _Var11._M_p = (pointer)this;
        eVar5 = getType(this,iVar6);
      }
      if (eVar5 == word) {
        token_00._M_str = local_78._M_dataplus._M_p;
        token_00._M_len = local_78._M_string_length;
        _Var11._M_p = (pointer)this;
        addSubwords(this,local_40,token_00,iVar6);
        local_58._M_allocated_capacity._0_4_ = h;
        if ((int *)local_98._8_8_ == local_88) {
          _Var11._M_p = (pointer)&local_98;
          std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                    ((vector<int,_std::allocator<int>_> *)&local_98,(iterator)local_98._8_8_,
                     (int *)local_58._M_local_buf);
        }
        else {
          *(uint32_t *)local_98._8_8_ = h;
          local_98._8_8_ = local_98._8_8_ + 4;
        }
      }
      else if ((-1 < iVar6) && (eVar5 == label)) {
        iVar10 = iVar6 - this->nwords_;
        local_58._M_allocated_capacity._0_4_ = iVar10;
        __position._M_current = *(int **)((long)local_48 + 8);
        _Var11._M_p = (pointer)local_48;
        if (__position._M_current ==
            (int *)((basic_string_view<char,_std::char_traits<char>_> *)
                   (local_48->_M_local_buf + 0x10))->_M_len) {
          std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                    ((vector<int,_std::allocator<int>_> *)local_48,__position,
                     (int *)local_58._M_local_buf);
        }
        else {
          *__position._M_current = iVar10;
          *(int **)((long)local_48 + 8) = __position._M_current + 1;
        }
      }
      iVar9 = iVar9 + 1;
    } while (local_78._M_string_length != DAT_00137478);
    if (local_78._M_string_length == 0) break;
    _Var11._M_p = local_78._M_dataplus._M_p;
    iVar10 = bcmp(local_78._M_dataplus._M_p,EOS_abi_cxx11_,local_78._M_string_length);
  } while (iVar10 != 0);
LAB_0011352c:
  addWordNgrams(this,local_40,(vector<int,_std::allocator<int>_> *)&local_98,
                ((this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                )->wordNgrams);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,
                    CONCAT71(local_78.field_2._M_allocated_capacity._1_7_,
                             local_78.field_2._M_local_buf[0]) + 1);
  }
  if ((void *)local_98._M_allocated_capacity != (void *)0x0) {
    operator_delete((void *)local_98._M_allocated_capacity,(long)local_88 - local_98._0_8_);
  }
  return iVar9;
}

Assistant:

int32_t Dictionary::getLine(
    std::istream& in,
    std::vector<int32_t>& words,
    std::vector<int32_t>& labels) const {
  std::vector<int32_t> word_hashes;
  std::string token;
  int32_t ntokens = 0;

  reset(in);
  words.clear();
  labels.clear();
  while (readWord(in, token)) {
    uint32_t h = hash(token);
    int32_t wid = getId(token, h);
    entry_type type = wid < 0 ? getType(token) : getType(wid);

    ntokens++;
    if (type == entry_type::word) {
      addSubwords(words, token, wid);
      word_hashes.push_back(h);
    } else if (type == entry_type::label && wid >= 0) {
      labels.push_back(wid - nwords_);
    }
    if (token == EOS) {
      break;
    }
  }
  addWordNgrams(words, word_hashes, args_->wordNgrams);
  return ntokens;
}